

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_api.h
# Opt level: O0

bool __thiscall benchmark::State::KeepRunning(State *this)

{
  ulong uVar1;
  ulong uVar2;
  byte *in_RDI;
  bool res;
  byte local_1a;
  byte local_19;
  
  if (((*in_RDI ^ 0xff) & 1) != 0) {
    if (((in_RDI[1] ^ 0xff) & 1) == 0) {
      __assert_fail("!finished_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/include/benchmark/benchmark_api.h"
                    ,0x119,"bool benchmark::State::KeepRunning()");
    }
    *in_RDI = 1;
    ResumeTiming(this);
  }
  uVar1 = *(ulong *)(in_RDI + 8);
  *(ulong *)(in_RDI + 8) = uVar1 + 1;
  uVar2 = *(ulong *)(in_RDI + 0x48);
  if (uVar1 >= uVar2) {
    local_19 = 0;
    if ((*in_RDI & 1) != 0) {
      local_1a = 1;
      if ((in_RDI[1] & 1) != 0) {
        local_1a = in_RDI[0x3c];
      }
      local_19 = local_1a;
    }
    if ((local_19 & 1) == 0) {
      __assert_fail("started_ && (!finished_ || error_occurred_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/include/benchmark/benchmark_api.h"
                    ,0x11f,"bool benchmark::State::KeepRunning()");
    }
    if ((in_RDI[0x3c] & 1) == 0) {
      PauseTiming(this);
    }
    *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 0x48);
    in_RDI[1] = 1;
  }
  return uVar1 < uVar2;
}

Assistant:

bool KeepRunning() {
    if (BENCHMARK_BUILTIN_EXPECT(!started_, false)) {
      assert(!finished_);
      started_ = true;
      ResumeTiming();
    }
    bool const res = total_iterations_++ < max_iterations;
    if (BENCHMARK_BUILTIN_EXPECT(!res, false)) {
      assert(started_ && (!finished_ || error_occurred_));
      if (!error_occurred_) {
        PauseTiming();
      }
      // Total iterations now is one greater than max iterations. Fix this.
      total_iterations_ = max_iterations;
      finished_ = true;
    }
    return res;
  }